

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Core.cpp
# Opt level: O2

bool __thiscall Core::keysCheck(Core *this)

{
  bool bVar1;
  Core *this_00;
  allocator<char> local_31;
  
  bVar1 = Parsing::Parser::loadKeys(&this->_p);
  if (!bVar1) {
    this_00 = (Core *)&stack0xffffffffffffffd0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&stack0xffffffffffffffd0,"Missing keyword_lists.txt in rsrc!",&local_31);
    error(this_00,(string *)&stack0xffffffffffffffd0,true);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  }
  return bVar1;
}

Assistant:

bool Core::keysCheck()
{
    if (!_p.loadKeys())
        return error("Missing keyword_lists.txt in rsrc!", true);
    return true;
}